

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlunicode.c
# Opt level: O2

int xmlUCSIsCatZs(int code)

{
  uint uVar1;
  
  uVar1 = 1;
  if ((((code != 0x20) && (code != 0xa0)) && (code != 0x1680)) &&
     (((code != 0x180e && (10 < code - 0x2000U)) && ((code != 0x202f && (code != 0x205f)))))) {
    uVar1 = (uint)(code == 0x3000);
  }
  return uVar1;
}

Assistant:

int
xmlUCSIsCatZs(int code) {
    return((code == 0x20) ||
           (code == 0xa0) ||
           (code == 0x1680) ||
           (code == 0x180e) ||
           ((code >= 0x2000) && (code <= 0x200a)) ||
           (code == 0x202f) ||
           (code == 0x205f) ||
           (code == 0x3000));
}